

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<45UL,_GF2::MOLex<45UL>_>::SymDiffSplice
          (MP<45UL,_GF2::MOLex<45UL>_> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  undefined8 unaff_RBX;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  uint in_stack_00000008;
  
  if (this == polyRight) {
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::clear
              (&this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
    return;
  }
  p_Var3 = (this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
           super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var5 = (polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
           super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var4 = p_Var5;
  if (p_Var5 != (_List_node_base *)polyRight && p_Var3 != (_List_node_base *)this) {
    do {
      if (*(ulong *)&((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)(p_Var4 + 1))->
                     super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> <
          *(ulong *)&((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)(p_Var3 + 1))->
                     super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>) {
        p_Var3 = (((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)&p_Var3->_M_next)->
                 super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        p_Var5 = p_Var4;
      }
      else if (*(ulong *)&((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)(p_Var3 + 1))->
                          super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> ==
               *(ulong *)&((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)(p_Var4 + 1))->
                          super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>) {
        p_Var2 = p_Var3->_M_next;
        psVar1 = &(this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
                  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var3,0x18);
        p_Var5 = (((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)&p_Var4->_M_next)->
                 super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        p_Var3 = p_Var2;
      }
      else {
        p_Var5 = p_Var4->_M_next;
        std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::splice
                  (&this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>,(int)p_Var3,
                   (__off64_t *)polyRight,(int)p_Var4,in_R8,in_R9,(uint)unaff_RBX);
      }
    } while ((p_Var3 != (_List_node_base *)this) &&
            (p_Var4 = p_Var5, p_Var5 != (_List_node_base *)polyRight));
  }
  if (p_Var3 != (_List_node_base *)this) {
    return;
  }
  std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::splice
            (&this->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>,(int)this,
             (__off64_t *)polyRight,(int)p_Var5,(__off64_t *)polyRight,in_R9,in_stack_00000008);
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin(), iterRight = polyRight.begin(), iterNext;
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// *iter < *iterRight?
				if (cmp < 0)
				{
					// запомнить следующий моном polyRight
					++(iterNext = iterRight);
					// перенести *iterRight перед *iter	
					splice(iter, polyRight, iterRight);
					// перейти к следующему моному polyRight
					iterRight = iterNext;
				}
				// *iter == *iterRight?
				else iter = erase(iter), ++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			splice(end(), polyRight, iterRight, polyRight.end());
	}